

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O2

MetaPipeline * __thiscall duckdb::MetaPipeline::GetLastChild(MetaPipeline *this)

{
  pointer psVar1;
  pointer psVar2;
  const_reference pvVar3;
  MetaPipeline *pMVar4;
  type pMVar5;
  
  if ((this->children).
      super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->children).
      super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    while( true ) {
      pvVar3 = vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true>::back(&this->children);
      pMVar4 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(pvVar3);
      psVar1 = (pMVar4->children).
               super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
               .
               super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (pMVar4->children).
               super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
               .
               super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar3 = vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true>::back(&this->children);
      if (psVar1 == psVar2) break;
      this = shared_ptr<duckdb::MetaPipeline,_true>::operator->(pvVar3);
    }
    pMVar5 = shared_ptr<duckdb::MetaPipeline,_true>::operator*(pvVar3);
    return pMVar5;
  }
  return this;
}

Assistant:

MetaPipeline &MetaPipeline::GetLastChild() {
	if (children.empty()) {
		return *this;
	}
	reference<const vector<shared_ptr<MetaPipeline>>> current_children = children;
	while (!current_children.get().back()->children.empty()) {
		current_children = current_children.get().back()->children;
	}
	return *current_children.get().back();
}